

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall mjs::hoisting_visitor::operator()(hoisting_visitor *this,switch_statement *s)

{
  bool bVar1;
  clause_list *this_00;
  reference this_01;
  statement_list *this_02;
  reference this_03;
  type s_00;
  unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *cs;
  const_iterator __end3;
  const_iterator __begin3;
  statement_list *__range3;
  case_clause *c;
  const_iterator __end2;
  const_iterator __begin2;
  clause_list *__range2;
  switch_statement *s_local;
  hoisting_visitor *this_local;
  
  this_00 = switch_statement::cl(s);
  __end2 = std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::begin(this_00);
  c = (case_clause *)std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_mjs::case_clause_*,_std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>_>
                                *)&c);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_mjs::case_clause_*,_std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>_>
              ::operator*(&__end2);
    this_02 = case_clause::sl(this_01);
    __end3 = std::
             vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
             ::begin(this_02);
    cs = (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
         std::
         vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
         ::end(this_02);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
                                  *)&cs);
      if (!bVar1) break;
      this_03 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
                ::operator*(&__end3);
      s_00 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                       (this_03);
      accept<mjs::hoisting_visitor>(s_00,this);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_mjs::case_clause_*,_std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void operator()(const switch_statement& s) {
        for (const auto& c: s.cl()) {
            for (const auto& cs: c.sl()) {
                accept(*cs, *this);
            }
        }
    }